

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void google::protobuf::internal::MapFieldPrinterHelper::CopyKey
               (MapKey *key,Message *message,FieldDescriptor *field_desc)

{
  pointer pcVar1;
  bool value;
  uint32_t value_00;
  int32_t value_01;
  LogMessage *other;
  uint64_t value_02;
  string *psVar2;
  int64_t value_03;
  Reflection *this;
  FieldDescriptor *local_88;
  string local_80;
  code *local_60 [7];
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  if (*(once_flag **)(field_desc + 0x18) != (once_flag *)0x0) {
    local_60[0] = FieldDescriptor::TypeOnceInit;
    local_88 = field_desc;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field_desc + 0x18),local_60,&local_88);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field_desc[2] * 4)) {
  case 1:
    value_01 = MapKey::GetInt32Value(key);
    Reflection::SetInt32(this,message,field_desc,value_01);
    break;
  case 2:
    value_03 = MapKey::GetInt64Value(key);
    Reflection::SetInt64(this,message,field_desc,value_03);
    break;
  case 3:
    value_00 = MapKey::GetUInt32Value(key);
    Reflection::SetUInt32(this,message,field_desc,value_00);
    break;
  case 4:
    value_02 = MapKey::GetUInt64Value(key);
    Reflection::SetUInt64(this,message,field_desc,value_02);
    break;
  case 5:
  case 6:
  case 8:
  case 10:
    LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x91e);
    other = LogMessage::operator<<((LogMessage *)local_60,"Not supported.");
    LogFinisher::operator=((LogFinisher *)&local_88,other);
    LogMessage::~LogMessage((LogMessage *)local_60);
    break;
  case 7:
    value = MapKey::GetBoolValue(key);
    Reflection::SetBool(this,message,field_desc,value);
    break;
  case 9:
    psVar2 = MapKey::GetStringValue_abi_cxx11_(key);
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + psVar2->_M_string_length);
    Reflection::SetString(this,message,field_desc,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyKey(const MapKey& key, Message* message,
                                    const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      GOOGLE_LOG(ERROR) << "Not supported.";
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc, key.GetStringValue());
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, key.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, key.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, key.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, key.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, key.GetBoolValue());
      return;
  }
}